

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp:108:50)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_error_object_cpp:108:50)>
       *this,model *to)

{
  to->_vptr_model = (_func_int **)&PTR_destroy_001c49f0;
  *(native_error_type *)&to[1]._vptr_model = (this->f).error_type;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(to + 2),(gc_heap_ptr_untyped *)&(this->f).n);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(to + 4),&(this->f).prototype.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)(to + 6),&(this->f).global.super_gc_heap_ptr_untyped);
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }